

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int little2_prologTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char *pcVar1;
  byte bVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  byte bVar10;
  byte *pbVar11;
  byte *pbVar12;
  byte *pbVar13;
  
  if (end <= ptr) {
    return -4;
  }
  uVar8 = (long)end - (long)ptr;
  pbVar11 = (byte *)(ptr + (uVar8 & 0xfffffffffffffffe));
  if ((uVar8 & 0xfffffffffffffffe) == 0) {
    pbVar11 = (byte *)end;
  }
  if ((uVar8 & 1) == 0) {
    pbVar11 = (byte *)end;
  }
  if (uVar8 == 1) {
    return -1;
  }
  bVar2 = ptr[1];
  if (bVar2 - 0xd8 < 4) {
switchD_0044a7c5_caseD_7:
    if ((long)pbVar11 - (long)ptr < 4) {
      return -2;
    }
    goto switchD_0044a8cb_caseD_5;
  }
  if (bVar2 - 0xdc < 4) goto switchD_0044a8cb_caseD_5;
  iVar9 = 0x12;
  if (bVar2 != 0) {
    if ((bVar2 != 0xff) || ((byte)*ptr < 0xfe)) goto switchD_0044a7c5_caseD_1d;
    goto switchD_0044a8cb_caseD_5;
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 2:
    pbVar12 = (byte *)(ptr + 2);
    if ((long)pbVar11 - (long)pbVar12 < 2) {
      return -1;
    }
    bVar2 = ptr[3];
    if (3 < bVar2 - 0xdc) {
      if (bVar2 == 0) {
        bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar12);
        switch(bVar2) {
        case 0xf:
          iVar9 = little2_scanPi(enc,ptr + 4,(char *)pbVar11,nextTokPtr);
          return iVar9;
        case 0x10:
          pbVar12 = (byte *)(ptr + 4);
          if ((long)pbVar11 - (long)pbVar12 < 2) {
            return -1;
          }
          if (ptr[5] == '\0') {
            switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar12)) {
            case 0x14:
              *nextTokPtr = ptr + 6;
              return 0x21;
            case 0x16:
            case 0x18:
              pbVar12 = (byte *)(ptr + 6);
              pbVar11 = pbVar11 + (-6 - (long)ptr);
LAB_0044ae28:
              if ((long)pbVar11 < 2) {
                return -1;
              }
              ptr = (char *)pbVar12;
              if (pbVar12[1] != 0) goto switchD_0044a8cb_caseD_5;
              bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar12);
              switch(bVar2) {
              case 0x15:
                break;
              case 0x16:
              case 0x18:
                goto switchD_0044ae58_caseD_16;
              case 0x17:
              case 0x19:
              case 0x1a:
              case 0x1b:
              case 0x1c:
              case 0x1d:
                goto switchD_0044a8cb_caseD_5;
              case 0x1e:
                if (pbVar11 < (byte *)0x4) {
                  return -1;
                }
                if (((pbVar12[3] == 0) &&
                    (uVar5 = (uint)*(byte *)((long)enc[1].scanners + (ulong)pbVar12[2]),
                    uVar5 < 0x1f)) && ((0x40200600U >> (uVar5 & 0x1f) & 1) != 0))
                goto switchD_0044a8cb_caseD_5;
                break;
              default:
                if (1 < bVar2 - 9) goto switchD_0044a8cb_caseD_5;
              }
              *nextTokPtr = (char *)pbVar12;
              return 0x10;
            case 0x1b:
              iVar9 = little2_scanComment(enc,ptr + 6,(char *)pbVar11,nextTokPtr);
              return iVar9;
            }
          }
          break;
        case 0x11:
        case 0x12:
        case 0x13:
        case 0x14:
        case 0x15:
        case 0x17:
          break;
        case 0x16:
        case 0x18:
switchD_0044ad62_caseD_16:
          *nextTokPtr = ptr;
          return 0x1d;
        default:
          if ((bVar2 - 5 < 3) || (bVar2 == 0x1d)) goto switchD_0044ad62_caseD_16;
        }
      }
      else if ((bVar2 != 0xff) || (*pbVar12 < 0xfe)) goto switchD_0044ad62_caseD_16;
    }
    *nextTokPtr = (char *)pbVar12;
    goto LAB_0044a8e8;
  default:
    goto switchD_0044a8cb_caseD_5;
  case 4:
    pcVar1 = ptr + 2;
    if ((long)pbVar11 - (long)pcVar1 < 2) {
      iVar9 = -0x1a;
    }
    else {
      if ((ptr[3] == '\0') && (*pcVar1 == ']')) {
        if ((ulong)((long)pbVar11 - (long)pcVar1) < 4) {
          return -1;
        }
        if ((ptr[5] == '\0') && (ptr[4] == '>')) {
          *nextTokPtr = ptr + 6;
          return 0x22;
        }
      }
      *nextTokPtr = pcVar1;
      iVar9 = 0x1a;
    }
    break;
  case 5:
    if ((long)pbVar11 - (long)ptr < 2) {
      return -2;
    }
    goto switchD_0044a8cb_caseD_5;
  case 6:
    if ((long)pbVar11 - (long)ptr < 3) {
      return -2;
    }
    goto switchD_0044a8cb_caseD_5;
  case 7:
    goto switchD_0044a7c5_caseD_7;
  case 9:
    if ((byte *)(ptr + 2) == pbVar11) {
      *nextTokPtr = (char *)pbVar11;
      return -0xf;
    }
  case 10:
  case 0x15:
    lVar6 = (long)pbVar11 - (long)ptr;
    do {
      pbVar12 = (byte *)ptr;
      ptr = (char *)(pbVar12 + 2);
      lVar6 = lVar6 + -2;
      if ((lVar6 < 2) || (pbVar12[3] != 0)) break;
      cVar3 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr);
    } while (((cVar3 == '\x15') || (cVar3 == '\n')) || ((cVar3 == '\t' && (pbVar12 + 4 != pbVar11)))
            );
    *nextTokPtr = ptr;
    iVar9 = 0xf;
    break;
  case 0xb:
    *nextTokPtr = ptr + 2;
    iVar9 = 0x11;
    break;
  case 0xc:
    iVar9 = 0xc;
    goto LAB_0044aab1;
  case 0xd:
    iVar9 = 0xd;
LAB_0044aab1:
    iVar9 = little2_scanLit(iVar9,enc,ptr + 2,(char *)pbVar11,nextTokPtr);
    return iVar9;
  case 0x13:
    pbVar12 = (byte *)(ptr + 2);
    pbVar13 = pbVar11 + -(long)pbVar12;
    if ((long)pbVar13 < 2) {
      return -1;
    }
    bVar2 = ptr[3];
    iVar7 = 0;
    if (bVar2 - 0xd8 < 4) {
joined_r0x0044ac3a:
      iVar9 = iVar7;
      if (pbVar13 < (byte *)0x4) {
        return -2;
      }
    }
    else {
      iVar9 = 0;
      if (3 < bVar2 - 0xdc) {
        if (bVar2 == 0) {
          bVar10 = *pbVar12;
          cVar3 = *(char *)((long)enc[1].scanners + (ulong)bVar10);
          if (cVar3 == '\x06') {
            iVar9 = iVar7;
            if (pbVar13 == (byte *)0x2) {
              return -2;
            }
          }
          else {
            if (cVar3 == '\a') goto joined_r0x0044ac3a;
            if ((cVar3 == '\x16') || (cVar3 == '\x18')) goto LAB_0044ac7c;
            iVar9 = iVar7;
            if (cVar3 == '\x1d') goto LAB_0044ac48;
          }
        }
        else {
          if (bVar2 == 0xff) {
            bVar10 = *pbVar12;
            if (0xfd < bVar10) goto switchD_0044ad44_caseD_8;
          }
          else {
            bVar10 = *pbVar12;
          }
LAB_0044ac48:
          iVar9 = iVar7;
          if ((*(uint *)((long)namingBitmap +
                        (ulong)(bVar10 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar2] << 5))
               >> (bVar10 & 0x1f) & 1) != 0) {
LAB_0044ac7c:
            pbVar12 = (byte *)(ptr + 4);
            pbVar11 = pbVar11 + (-6 - (long)ptr);
            while( true ) {
              pbVar13 = pbVar11 + 2;
              if ((long)pbVar13 < 2) {
                return -0x14;
              }
              bVar2 = pbVar12[1];
              if (bVar2 == 0) break;
              if (bVar2 == 0xff) {
                uVar5 = (uint)*pbVar12;
                iVar9 = iVar7;
                if (0xfd < *pbVar12) goto switchD_0044ad44_caseD_8;
              }
              else {
                if (bVar2 - 0xd8 < 4) goto switchD_0044ad44_caseD_7;
                iVar9 = iVar7;
                if (bVar2 - 0xdc < 4) goto switchD_0044ad44_caseD_8;
                uVar5 = (uint)*pbVar12;
              }
switchD_0044ad44_caseD_1d:
              iVar9 = iVar7;
              if ((*(uint *)((long)namingBitmap +
                            (ulong)(uVar5 >> 3 & 0x1c |
                                   (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar2] << 5)) >>
                   (uVar5 & 0x1f) & 1) == 0) goto switchD_0044ad44_caseD_8;
switchD_0044ad44_caseD_16:
              pbVar12 = pbVar12 + 2;
              pbVar11 = pbVar11 + -2;
            }
            uVar5 = (uint)*pbVar12;
            iVar9 = iVar7;
            switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar12)) {
            case 6:
              if (pbVar11 == (byte *)0x0) {
                return -2;
              }
              break;
            case 7:
switchD_0044ad44_caseD_7:
              goto joined_r0x0044ac3a;
            default:
              break;
            case 9:
            case 10:
            case 0xb:
            case 0x15:
            case 0x1e:
            case 0x20:
            case 0x24:
              iVar9 = 0x14;
              break;
            case 0x16:
            case 0x18:
            case 0x19:
            case 0x1a:
            case 0x1b:
              goto switchD_0044ad44_caseD_16;
            case 0x1d:
              goto switchD_0044ad44_caseD_1d;
            }
          }
        }
      }
    }
switchD_0044ad44_caseD_8:
    *nextTokPtr = (char *)pbVar12;
    break;
  case 0x14:
    *nextTokPtr = ptr + 2;
    iVar9 = 0x19;
    break;
  case 0x16:
  case 0x18:
switchD_0044a7c5_caseD_16:
    bVar4 = false;
    goto LAB_0044a830;
  case 0x19:
  case 0x1a:
  case 0x1b:
switchD_0044a7c5_caseD_19:
    iVar9 = 0x13;
    bVar4 = true;
LAB_0044a830:
    uVar8 = (long)pbVar11 - (long)ptr;
    ptr = ptr + 2;
    while (uVar8 = uVar8 - 2, 1 < (long)uVar8) {
      bVar2 = ((byte *)ptr)[1];
      if (bVar2 == 0) {
        switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
        default:
          goto switchD_0044a8cb_caseD_5;
        case 6:
          if (uVar8 == 2) {
            return -2;
          }
          goto switchD_0044a8cb_caseD_5;
        case 7:
switchD_0044a8cb_caseD_7:
          if (uVar8 < 4) {
            return -2;
          }
          goto switchD_0044a8cb_caseD_5;
        case 9:
        case 10:
        case 0xb:
        case 0x14:
        case 0x15:
        case 0x1e:
        case 0x20:
        case 0x23:
        case 0x24:
          *nextTokPtr = ptr;
          return iVar9;
        case 0xf:
          if (!bVar4) {
            *nextTokPtr = (char *)((byte *)ptr + 2);
            return 0x1e;
          }
          goto switchD_0044a8cb_caseD_5;
        case 0x16:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
          goto switchD_0044a8cb_caseD_16;
        case 0x1d:
          goto switchD_0044a8cb_caseD_1d;
        case 0x21:
          if (!bVar4) {
            *nextTokPtr = (char *)((byte *)ptr + 2);
            return 0x1f;
          }
          goto switchD_0044a8cb_caseD_5;
        case 0x22:
          if (!bVar4) {
            *nextTokPtr = (char *)((byte *)ptr + 2);
            return 0x20;
          }
          goto switchD_0044a8cb_caseD_5;
        }
      }
      if (bVar2 == 0xff) {
        if (0xfd < (byte)*ptr) goto switchD_0044a8cb_caseD_5;
      }
      else {
        if (bVar2 - 0xd8 < 4) goto switchD_0044a8cb_caseD_7;
        if (bVar2 - 0xdc < 4) goto switchD_0044a8cb_caseD_5;
      }
switchD_0044a8cb_caseD_1d:
      if ((*(uint *)((long)namingBitmap +
                    (ulong)((byte)*ptr >> 3 & 0x1c |
                           (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar2] << 5)) >> ((byte)*ptr & 0x1f)
          & 1) == 0) goto switchD_0044a8cb_caseD_5;
switchD_0044a8cb_caseD_16:
      ptr = (char *)((byte *)ptr + 2);
    }
    iVar9 = -iVar9;
    break;
  case 0x1d:
switchD_0044a7c5_caseD_1d:
    bVar10 = *ptr;
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((uint)"\x02\x03\x04\x05\x06\a\b"[bVar2] * 0x20 + (uint)(bVar10 >> 5) * 4))
         >> (bVar10 & 0x1f) & 1) != 0) goto switchD_0044a7c5_caseD_16;
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar2] * 0x20 +
                         (uint)(bVar10 >> 5) * 4)) & 1 << (bVar10 & 0x1f)) != 0)
    goto switchD_0044a7c5_caseD_19;
switchD_0044a8cb_caseD_5:
    *nextTokPtr = ptr;
LAB_0044a8e8:
    iVar9 = 0;
    break;
  case 0x1e:
    iVar9 = little2_scanPercent(enc,ptr + 2,(char *)pbVar11,nextTokPtr);
    return iVar9;
  case 0x1f:
    *nextTokPtr = ptr + 2;
    iVar9 = 0x17;
    break;
  case 0x20:
    pbVar12 = (byte *)(ptr + 2);
    if ((long)pbVar11 - (long)pbVar12 < 2) {
      return -0x18;
    }
    if (ptr[3] == '\0') {
      bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar12);
      switch(bVar2) {
      case 0x20:
      case 0x23:
      case 0x24:
switchD_0044abc9_caseD_20:
        *nextTokPtr = (char *)pbVar12;
        return 0x18;
      case 0x21:
        *nextTokPtr = ptr + 4;
        return 0x24;
      case 0x22:
        *nextTokPtr = ptr + 4;
        return 0x25;
      default:
        if (bVar2 - 9 < 3) goto switchD_0044abc9_caseD_20;
      }
      if (bVar2 == 0xf) {
        *nextTokPtr = ptr + 4;
        return 0x23;
      }
      if (bVar2 == 0x15) goto switchD_0044abc9_caseD_20;
    }
    *nextTokPtr = (char *)pbVar12;
    goto LAB_0044a8e8;
  case 0x23:
    *nextTokPtr = ptr + 2;
    iVar9 = 0x26;
    break;
  case 0x24:
    *nextTokPtr = ptr + 2;
    iVar9 = 0x15;
  }
  return iVar9;
switchD_0044ae58_caseD_16:
  pbVar12 = pbVar12 + 2;
  pbVar11 = pbVar11 + -2;
  goto LAB_0044ae28;
}

Assistant:

static int PTRCALL
PREFIX(prologTok)(const ENCODING *enc, const char *ptr, const char *end,
                  const char **nextTokPtr)
{
  int tok;
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_QUOT:
    return PREFIX(scanLit)(BT_QUOT, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_APOS:
    return PREFIX(scanLit)(BT_APOS, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LT:
    {
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_EXCL:
        return PREFIX(scanDecl)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      case BT_QUEST:
        return PREFIX(scanPi)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      case BT_NMSTRT:
      case BT_HEX:
      case BT_NONASCII:
      case BT_LEAD2:
      case BT_LEAD3:
      case BT_LEAD4:
        *nextTokPtr = ptr - MINBPC(enc);
        return XML_TOK_INSTANCE_START;
      }
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  case BT_CR:
    if (ptr + MINBPC(enc) == end) {
      *nextTokPtr = end;
      /* indicate that this might be part of a CR/LF pair */
      return -XML_TOK_PROLOG_S;
    }
    /* fall through */
  case BT_S: case BT_LF:
    for (;;) {
      ptr += MINBPC(enc);
      if (! HAS_CHAR(enc, ptr, end))
        break;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_LF:
        break;
      case BT_CR:
        /* don't split CR/LF pair */
        if (ptr + MINBPC(enc) != end)
          break;
        /* fall through */
      default:
        *nextTokPtr = ptr;
        return XML_TOK_PROLOG_S;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_PROLOG_S;
  case BT_PERCNT:
    return PREFIX(scanPercent)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_COMMA:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COMMA;
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_BRACKET;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_BRACKET;
    if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
      REQUIRE_CHARS(enc, ptr, end, 2);
      if (CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_GT)) {
        *nextTokPtr = ptr + 2*MINBPC(enc);
        return XML_TOK_COND_SECT_CLOSE;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_CLOSE_BRACKET;
  case BT_LPAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_PAREN;
  case BT_RPAR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_PAREN;
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_AST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_ASTERISK;
    case BT_QUEST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_QUESTION;
    case BT_PLUS:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_PLUS;
    case BT_CR: case BT_LF: case BT_S:
    case BT_GT: case BT_COMMA: case BT_VERBAR:
    case BT_RPAR:
      *nextTokPtr = ptr;
      return XML_TOK_CLOSE_PAREN;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  case BT_VERBAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OR;
  case BT_GT:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DECL_CLOSE;
  case BT_NUM:
    return PREFIX(scanPoundName)(enc, ptr + MINBPC(enc), end, nextTokPtr);
#define LEAD_CASE(n) \
  case BT_LEAD ## n: \
    if (end - ptr < n) \
      return XML_TOK_PARTIAL_CHAR; \
    if (IS_NMSTRT_CHAR(enc, ptr, n)) { \
      ptr += n; \
      tok = XML_TOK_NAME; \
      break; \
    } \
    if (IS_NAME_CHAR(enc, ptr, n)) { \
      ptr += n; \
      tok = XML_TOK_NMTOKEN; \
      break; \
    } \
    *nextTokPtr = ptr; \
    return XML_TOK_INVALID;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
  case BT_NMSTRT:
  case BT_HEX:
    tok = XML_TOK_NAME;
    ptr += MINBPC(enc);
    break;
  case BT_DIGIT:
  case BT_NAME:
  case BT_MINUS:
#ifdef XML_NS
  case BT_COLON:
#endif
    tok = XML_TOK_NMTOKEN;
    ptr += MINBPC(enc);
    break;
  case BT_NONASCII:
    if (IS_NMSTRT_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NAME;
      break;
    }
    if (IS_NAME_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NMTOKEN;
      break;
    }
    /* fall through */
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_GT: case BT_RPAR: case BT_COMMA:
    case BT_VERBAR: case BT_LSQB: case BT_PERCNT:
    case BT_S: case BT_CR: case BT_LF:
      *nextTokPtr = ptr;
      return tok;
#ifdef XML_NS
    case BT_COLON:
      ptr += MINBPC(enc);
      switch (tok) {
      case XML_TOK_NAME:
        REQUIRE_CHAR(enc, ptr, end);
        tok = XML_TOK_PREFIXED_NAME;
        switch (BYTE_TYPE(enc, ptr)) {
        CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
        default:
          tok = XML_TOK_NMTOKEN;
          break;
        }
        break;
      case XML_TOK_PREFIXED_NAME:
        tok = XML_TOK_NMTOKEN;
        break;
      }
      break;
#endif
    case BT_PLUS:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_PLUS;
    case BT_AST:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_ASTERISK;
    case BT_QUEST:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_QUESTION;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return -tok;
}